

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O0

bool __thiscall axl::io::SockAddrParser::tryInt(SockAddrParser *this,int radix)

{
  char *pcVar1;
  int iVar2;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar3;
  char *p;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  char *local_20;
  
  skipWhiteSpace((SockAddrParser *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  local_20 = (char *)*in_RDI;
  if (in_ESI == 0x10) {
    while( true ) {
      bVar3 = false;
      if (local_20 < (char *)in_RDI[1]) {
        iVar2 = isxdigit((int)*local_20);
        bVar3 = iVar2 != 0;
      }
      if (!bVar3) break;
      local_20 = local_20 + 1;
    }
  }
  else {
    while( true ) {
      bVar3 = false;
      if (local_20 < (char *)in_RDI[1]) {
        iVar2 = isdigit((int)*local_20);
        bVar3 = iVar2 != 0;
      }
      if (!bVar3) break;
      local_20 = local_20 + 1;
    }
  }
  pcVar1 = (char *)*in_RDI;
  if (pcVar1 != local_20) {
    *in_RDI = local_20;
  }
  return pcVar1 != local_20;
}

Assistant:

bool
SockAddrParser::tryInt(int radix) {
	skipWhiteSpace();

	const char* p = m_p;

	if (radix == 16) {
		while (p < m_end && isxdigit(*p))
			p++;
	} else {
		while (p < m_end && isdigit(*p))
			p++;
	}

	if (m_p == p)
		return false;

	m_p = p;
	return true;
}